

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationroot.cpp
# Opt level: O1

CollationCacheEntry * icu_63::CollationRoot::getRootCacheEntry(UErrorCode *errorCode)

{
  UBool UVar1;
  CollationCacheEntry *pCVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((anonymous_namespace)::initOnce == 2) ||
       (UVar1 = umtx_initImplPreInit((UInitOnce *)&(anonymous_namespace)::initOnce), UVar1 == '\0'))
    {
      if (U_ZERO_ERROR < DAT_003fdd2c) {
        *errorCode = DAT_003fdd2c;
      }
    }
    else {
      load(errorCode);
      DAT_003fdd2c = *errorCode;
      umtx_initImplPostInit((UInitOnce *)&(anonymous_namespace)::initOnce);
    }
  }
  pCVar2 = (anonymous_namespace)::rootSingleton;
  if (U_ZERO_ERROR < *errorCode) {
    pCVar2 = (CollationCacheEntry *)0x0;
  }
  return pCVar2;
}

Assistant:

const CollationCacheEntry *
CollationRoot::getRootCacheEntry(UErrorCode &errorCode) {
    umtx_initOnce(initOnce, CollationRoot::load, errorCode);
    if(U_FAILURE(errorCode)) { return NULL; }
    return rootSingleton;
}